

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

char * duckdb_logical_type_get_alias(duckdb_logical_type type)

{
  bool bVar1;
  char *pcVar2;
  string local_30;
  
  bVar1 = duckdb::LogicalType::HasAlias((LogicalType *)type);
  if (bVar1) {
    duckdb::LogicalType::GetAlias_abi_cxx11_(&local_30,(LogicalType *)type);
    pcVar2 = strdup(local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

char *duckdb_logical_type_get_alias(duckdb_logical_type type) {
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	return logical_type.HasAlias() ? strdup(logical_type.GetAlias().c_str()) : nullptr;
}